

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

void __thiscall Trie::Trie(Trie *this)

{
  undefined1 auStack_28 [8];
  Node root;
  Trie *this_local;
  
  root.value = (size_t)this;
  std::vector<Trie::Node,_std::allocator<Trie::Node>_>::vector(&this->nodes);
  std::
  map<Trie::LookupEntry,_unsigned_long,_std::less<Trie::LookupEntry>,_std::allocator<std::pair<const_Trie::LookupEntry,_unsigned_long>_>_>
  ::map(&this->lookup);
  auStack_28 = (undefined1  [8])0x0;
  root.index = 0;
  root.hasValue = false;
  root._9_7_ = 0;
  std::vector<Trie::Node,_std::allocator<Trie::Node>_>::push_back
            (&this->nodes,(value_type *)auStack_28);
  return;
}

Assistant:

Trie::Trie()
{
	Node root { 0, false, 0 };
	nodes.push_back(root);
}